

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FmtHelpers.cpp
# Opt level: O2

bool slang::ast::formatSpecialArg(char spec,Scope *scope,string *result)

{
  Symbol *this;
  char cVar1;
  SourceLibrary *__str;
  DefinitionSymbol *pDVar2;
  
  cVar1 = charToLower(spec);
  if (cVar1 == 'm') {
    Symbol::appendHierarchicalPath(scope->thisSym,result);
  }
  else {
    if (cVar1 != 'l') {
      return false;
    }
    this = scope->thisSym;
    __str = Symbol::getSourceLibrary(this);
    if (__str != (SourceLibrary *)0x0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (result,&__str->name);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (result,'.');
    }
    pDVar2 = Symbol::getDeclaringDefinition(this);
    if (pDVar2 == (DefinitionSymbol *)0x0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (result,"$unit");
    }
    else {
      std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                ((string *)result,&(pDVar2->super_Symbol).name);
    }
  }
  return true;
}

Assistant:

static bool formatSpecialArg(char spec, const Scope& scope, std::string& result) {
    switch (charToLower(spec)) {
        case 'l': {
            auto& sym = scope.asSymbol();
            if (auto lib = sym.getSourceLibrary()) {
                result += lib->name;
                result.push_back('.');
            }
            if (auto def = sym.getDeclaringDefinition())
                result += def->name;
            else
                result += "$unit";
            return true;
        }
        case 'm':
            scope.asSymbol().appendHierarchicalPath(result);
            return true;
        default:
            return false;
    }
}